

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

uint32_t mp_sizeof_array(uint32_t size)

{
  undefined4 local_c;
  uint32_t size_local;
  
  if (size < 0x10) {
    local_c = 1;
  }
  else if (size < 0x10000) {
    local_c = 3;
  }
  else {
    local_c = 5;
  }
  return local_c;
}

Assistant:

MP_IMPL uint32_t
mp_sizeof_array(uint32_t size)
{
	if (size <= 15) {
		return 1;
	} else if (size <= UINT16_MAX) {
		return 1 + sizeof(uint16_t);
	} else {
		return 1 + sizeof(uint32_t);
	}
}